

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.hpp
# Opt level: O2

string * CLI::detail::convert_arg_for_ini(string *__return_storage_ptr__,string *arg)

{
  char cVar1;
  size_type sVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  double *output;
  allocator local_51;
  double val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (arg->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x02');
    return __return_storage_ptr__;
  }
  bVar4 = ::std::operator==(arg,"true");
  if ((((bVar4) || (bVar4 = ::std::operator==(arg,"false"), bVar4)) ||
      (bVar4 = ::std::operator==(arg,"nan"), bVar4)) ||
     ((bVar4 = ::std::operator==(arg,"inf"), bVar4 ||
      (((iVar5 = ::std::__cxx11::string::compare((ulong)arg,0,(char *)0x2), iVar5 != 0 &&
        (iVar5 = ::std::__cxx11::string::compare((ulong)arg,0,(char *)0x2), iVar5 != 0)) &&
       (bVar4 = lexical_cast<double,_(CLI::detail::enabler)0>((detail *)arg,(string *)&val,output),
       bVar4)))))) goto LAB_00106fdf;
  sVar2 = arg->_M_string_length;
  if (sVar2 == 1) {
    ::std::__cxx11::string::string((string *)&local_30,"\'",&local_51);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                     &local_30,arg);
    ::std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,'\'')
    ;
    goto LAB_00107164;
  }
  pcVar3 = (arg->_M_dataplus)._M_p;
  if (*pcVar3 == '0') {
    cVar1 = pcVar3[1];
    if (cVar1 == 'b') {
      bVar4 = ::std::
              all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&)::_lambda(char)_3_>
                        (pcVar3 + 2,pcVar3 + sVar2);
    }
    else if (cVar1 == 'o') {
      bVar4 = ::std::
              all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&)::_lambda(char)_2_>
                        (pcVar3 + 2,pcVar3 + sVar2);
    }
    else {
      if (cVar1 != 'x') goto LAB_001070df;
      bVar4 = ::std::
              all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&)::_lambda(char)_1_>
                        (pcVar3 + 2,pcVar3 + sVar2);
    }
    if (bVar4 != false) {
LAB_00106fdf:
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)arg);
      return __return_storage_ptr__;
    }
  }
LAB_001070df:
  lVar6 = ::std::__cxx11::string::find((char)arg,0x22);
  if (lVar6 == -1) {
    ::std::__cxx11::string::string((string *)&local_30,"\"",&local_51);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                     &local_30,arg);
    ::std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,'\"')
    ;
  }
  else {
    ::std::__cxx11::string::string((string *)&local_30,"\'",&local_51);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                     &local_30,arg);
    ::std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,'\'')
    ;
  }
LAB_00107164:
  ::std::__cxx11::string::~string((string *)&val);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

inline std::string convert_arg_for_ini(const std::string &arg) {
    if(arg.empty()) {
        return std::string(2, '"');
    }
    // some specifically supported strings
    if(arg == "true" || arg == "false" || arg == "nan" || arg == "inf") {
        return arg;
    }
    // floating point conversion can convert some hex codes, but don't try that here
    if(arg.compare(0, 2, "0x") != 0 && arg.compare(0, 2, "0X") != 0) {
        double val;
        if(detail::lexical_cast(arg, val)) {
            return arg;
        }
    }
    // just quote a single non numeric character
    if(arg.size() == 1) {
        return std::string("'") + arg + '\'';
    }
    // handle hex, binary or octal arguments
    if(arg.front() == '0') {
        if(arg[1] == 'x') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) {
                   return (x >= '0' && x <= '9') || (x >= 'A' && x <= 'F') || (x >= 'a' && x <= 'f');
               })) {
                return arg;
            }
        } else if(arg[1] == 'o') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) { return (x >= '0' && x <= '7'); })) {
                return arg;
            }
        } else if(arg[1] == 'b') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) { return (x == '0' || x == '1'); })) {
                return arg;
            }
        }
    }
    if(arg.find_first_of('"') == std::string::npos) {
        return std::string("\"") + arg + '"';
    } else {
        return std::string("'") + arg + '\'';
    }
}